

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClusterList.h
# Opt level: O3

void __thiscall
SegmentClusterList<unsigned_int,_Memory::JitArenaAllocator,_16U>::Consolidate
          (SegmentClusterList<unsigned_int,_Memory::JitArenaAllocator,_16U> *this)

{
  uint **ppuVar1;
  uint *puVar2;
  uint *puVar3;
  ulong uVar4;
  uint j;
  uint uVar5;
  long lVar6;
  
  uVar5 = this->maxIndex;
  if (0xf < uVar5) {
    ppuVar1 = this->backingStore;
    uVar4 = 0;
    do {
      puVar2 = ppuVar1[uVar4];
      if (puVar2 != (uint *)0x0) {
        lVar6 = 0;
        do {
          uVar5 = puVar2[lVar6];
          if ((uVar5 < this->maxIndex) && (puVar3 = ppuVar1[uVar5 >> 4], puVar3 != (uint *)0x0)) {
            uVar5 = puVar3[uVar5 & 0xf];
          }
          puVar2[lVar6] = uVar5;
          lVar6 = lVar6 + 1;
        } while (lVar6 != 0x10);
        uVar5 = this->maxIndex;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < uVar5 >> 4);
  }
  this->consolidated = true;
  return;
}

Assistant:

void Consolidate()
    {
        for (indexType i = 0; i < maxIndex / numPerSegment; i++)
        {
            if (backingStore[i] != nullptr)
            {
                for (indexType j = 0; j < numPerSegment; j++)
                {
                    // We can assumeConsolidated here because everything less than the current index is consolidated
                    backingStore[i][j] = Lookup<false, true>(backingStore[i][j]);
                }
            }
        }
#if DBG
        consolidated = true;
#endif
    }